

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O2

void ncnn::lstm_dynamic_quantize
               (Mat *bottom_blob,Mat *bottom_blob_int8,Mat *bottom_blob_int8_descales,Option *opt)

{
  int _w;
  uint _w_00;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  float *ptr;
  float fVar6;
  
  _w = bottom_blob->w;
  _w_00 = bottom_blob->h;
  Mat::create(bottom_blob_int8_descales,_w_00,4,1,opt->blob_allocator);
  Mat::create(bottom_blob_int8,_w,_w_00,1,opt->blob_allocator);
  uVar5 = 0;
  uVar4 = (ulong)_w_00;
  if ((int)_w_00 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    ptr = (float *)((long)bottom_blob->w * uVar5 * bottom_blob->elemsize + (long)bottom_blob->data);
    iVar1 = bottom_blob_int8->w;
    sVar2 = bottom_blob_int8->elemsize;
    pvVar3 = bottom_blob_int8->data;
    fVar6 = lstm_dynamic_quantize_get_absmax(ptr,_w);
    *(float *)((long)bottom_blob_int8_descales->data + uVar5 * 4) = fVar6 * 0.007874016;
    lstm_dynamic_quantize_scale2int8
              (ptr,_w,127.0 / fVar6,(char *)((long)iVar1 * uVar5 * sVar2 + (long)pvVar3));
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize(const Mat& bottom_blob, Mat& bottom_blob_int8, Mat& bottom_blob_int8_descales, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    // dynamic quantize bottom_blob
    bottom_blob_int8_descales.create(T, (size_t)4u, 1, opt.blob_allocator);

    bottom_blob_int8.create(size, T, (size_t)1u, opt.blob_allocator);

    // fp32
    for (int t = 0; t < T; t++)
    {
        const float* ptr = bottom_blob.row(t);
        signed char* outptr = bottom_blob_int8.row<signed char>(t);

        const float absmax = lstm_dynamic_quantize_get_absmax(ptr, size);

        bottom_blob_int8_descales[t] = absmax / 127.f;

        const float scale = 127.f / absmax;
        lstm_dynamic_quantize_scale2int8(ptr, size, scale, outptr);
    }
}